

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridSpecs.hpp
# Opt level: O2

string * __thiscall
sciplot::GridSpecs::repr_abi_cxx11_(string *__return_storage_ptr__,GridSpecs *this)

{
  pointer pGVar1;
  ostream *poVar2;
  pointer pGVar3;
  string local_2e0;
  GridSpecsBase specs;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  GridSpecsBase::repr_abi_cxx11_((string *)&specs,&this->super_GridSpecsBase);
  std::operator<<(local_1a8,(string *)&specs);
  std::__cxx11::string::~string((string *)&specs);
  pGVar1 = (this->m_gridticsspecs).
           super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pGVar3 = (this->m_gridticsspecs).
                super__Vector_base<sciplot::GridSpecsBase,_std::allocator<sciplot::GridSpecsBase>_>.
                _M_impl.super__Vector_impl_data._M_start; pGVar3 != pGVar1; pGVar3 = pGVar3 + 1) {
    GridSpecsBase::GridSpecsBase(&specs,pGVar3);
    poVar2 = std::operator<<(local_1a8,'\n');
    GridSpecsBase::repr_abi_cxx11_(&local_2e0,&specs);
    std::operator<<(poVar2,(string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    GridSpecsBase::~GridSpecsBase(&specs);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

inline auto GridSpecs::repr() const -> std::string
{
    std::stringstream ss;
    ss << GridSpecsBase::repr();
    for (auto specs : m_gridticsspecs)
        ss << '\n'
           << specs.repr();
    return ss.str();
}